

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::Insert(FString *this,size_t index,char *instr,size_t instrlen)

{
  char *pcVar1;
  size_t sVar2;
  FStringData *pFVar3;
  char *pcVar4;
  FStringData *old;
  size_t mylen;
  size_t instrlen_local;
  char *instr_local;
  size_t index_local;
  FString *this_local;
  
  if (instrlen != 0) {
    sVar2 = Len(this);
    if (index < sVar2) {
      pFVar3 = Data(this);
      if (pFVar3->RefCount < 2) {
        ReallocBuffer(this,sVar2 + instrlen);
        memmove(this->Chars + instrlen + index,this->Chars + index,(sVar2 - index) + 1);
        memcpy(this->Chars + index,instr,instrlen);
      }
      else {
        pFVar3 = Data(this);
        AllocBuffer(this,sVar2 + instrlen);
        pcVar1 = this->Chars;
        pcVar4 = FStringData::Chars(pFVar3);
        StrCopy(pcVar1,pcVar4,index);
        StrCopy(this->Chars + index,instr,instrlen);
        pcVar1 = this->Chars;
        pcVar4 = FStringData::Chars(pFVar3);
        StrCopy(pcVar1 + instrlen + index,pcVar4 + index,sVar2 - index);
        FStringData::Release(pFVar3);
      }
    }
    else {
      AppendCStrPart(this,instr,instrlen);
    }
  }
  return;
}

Assistant:

void FString::Insert (size_t index, const char *instr, size_t instrlen)
{
	if (instrlen > 0)
	{
		size_t mylen = Len();
		if (index >= mylen)
		{
			AppendCStrPart(instr, instrlen);
		}
		else if (Data()->RefCount <= 1)
		{
			ReallocBuffer(mylen + instrlen);
			memmove(Chars + index + instrlen, Chars + index, (mylen - index + 1) * sizeof(char));
			memcpy(Chars + index, instr, instrlen * sizeof(char));
		}
		else
		{
			FStringData *old = Data();
			AllocBuffer(mylen + instrlen);
			StrCopy(Chars, old->Chars(), index);
			StrCopy(Chars + index, instr, instrlen);
			StrCopy(Chars + index + instrlen, old->Chars() + index, mylen - index);
			old->Release();
		}
	}
}